

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O2

Ngram Ngram_init_from_bin(char *mem)

{
  uint uVar1;
  Ngram pNVar2;
  HashVocab pHVar3;
  LowGram_T **ppLVar4;
  LowGram_T *pLVar5;
  long lVar6;
  char *mem_00;
  LowGram_T *pLVar7;
  ulong uVar8;
  
  pNVar2 = (Ngram)malloc(0x30);
  uVar1 = *(uint *)mem;
  uVar8 = (ulong)uVar1;
  pNVar2->ngram_order = uVar1;
  pNVar2->ngram_counts = (size_t *)(mem + 4);
  mem_00 = mem + uVar8 * 8 + 0xc;
  lVar6 = *(long *)(mem + uVar8 * 8 + 4);
  pHVar3 = HashVocab_init_from_bin(mem_00);
  pNVar2->vocab = pHVar3;
  pNVar2->uni_gram = (UniGram_T *)(mem_00 + lVar6);
  pLVar7 = (LowGram_T *)((UniGram_T *)(mem_00 + lVar6) + *(long *)(mem + 4) + 1);
  if (uVar8 < 3) {
    pNVar2->low_grams = (LowGram_T **)0x0;
  }
  else {
    ppLVar4 = (LowGram_T **)malloc((ulong)(uVar1 - 2) << 3);
    pNVar2->low_grams = ppLVar4;
    for (lVar6 = 0; uVar8 - 2 != lVar6; lVar6 = lVar6 + 1) {
      ppLVar4[lVar6] = pLVar7;
      pLVar7 = pLVar7 + *(long *)(mem + lVar6 * 8 + 0xc) + 1;
    }
  }
  pLVar5 = (LowGram_T *)0x0;
  if (1 < uVar1) {
    pLVar5 = pLVar7;
  }
  pNVar2->high_gram = (HighGram_T *)pLVar5;
  return pNVar2;
}

Assistant:

Ngram Ngram_init_from_bin(const char* mem){//assume ending is same
#define READ(ret, typ, ptr) ret =*(typ *)ptr;\
                            ptr+=sizeof(typ);
    Ngram model = malloc(sizeof(struct Ngram_T));
    READ(model->ngram_order, uint32_t, mem)

    model->ngram_counts = (size_t*)mem;
    mem += sizeof(size_t)*model->ngram_order;

    size_t vocab_mem_size;
    READ(vocab_mem_size, size_t, mem);
    //printf("vocab_mem_size:%zu\n", vocab_mem_size);
    model->vocab = HashVocab_init_from_bin(mem);
    mem += vocab_mem_size;

    model->uni_gram = (UniGram_T *)mem;
    mem += sizeof(UniGram_T) * (model->ngram_counts[0]+1);

    if (model->ngram_order > 2) {
        model->low_grams = malloc(sizeof(LowGram_T *)*(model->ngram_order-2));
        for (uint32_t order = 2; order < model->ngram_order; order++) {
            model->low_grams[order-2] = (LowGram_T*)mem;
            mem += sizeof(LowGram_T) * (model->ngram_counts[order-1]+1);
        }
    }else{
        model->low_grams = NULL;
    }
    if (model->ngram_order > 1) {
        model->high_gram = (HighGram_T *)mem; 
    }else{
        model->high_gram = NULL;
    }
    return model;
}